

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall FIX::double_conversion::Bignum::MultiplyByUInt64(Bignum *this,uint64_t factor)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  uint64_t tmp;
  uint64_t product_high;
  uint64_t product_low;
  int i;
  uint64_t high;
  uint64_t low;
  uint64_t carry;
  uint64_t factor_local;
  Bignum *this_local;
  
  if (factor != 1) {
    if (factor == 0) {
      Zero(this);
    }
    else {
      low = 0;
      for (product_low._4_4_ = 0; product_low._4_4_ < this->used_digits_;
          product_low._4_4_ = product_low._4_4_ + 1) {
        puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,product_low._4_4_);
        uVar1 = *puVar3;
        puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,product_low._4_4_);
        uVar2 = *puVar3;
        uVar4 = (low & 0xfffffff) + (factor & 0xffffffff) * (ulong)uVar1;
        puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,product_low._4_4_);
        *puVar3 = (uint)uVar4 & 0xfffffff;
        low = (low >> 0x1c) + (uVar4 >> 0x1c) + (factor >> 0x20) * (ulong)uVar2 * 0x10;
      }
      for (; low != 0; low = low >> 0x1c) {
        EnsureCapacity(this,this->used_digits_ + 1);
        puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,this->used_digits_);
        *puVar3 = (uint)low & 0xfffffff;
        this->used_digits_ = this->used_digits_ + 1;
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt64(uint64_t factor) {
  if (factor == 1) return;
  if (factor == 0) {
    Zero();
    return;
  }
  ASSERT(kBigitSize < 32);
  uint64_t carry = 0;
  uint64_t low = factor & 0xFFFFFFFF;
  uint64_t high = factor >> 32;
  for (int i = 0; i < used_digits_; ++i) {
    uint64_t product_low = low * bigits_[i];
    uint64_t product_high = high * bigits_[i];
    uint64_t tmp = (carry & kBigitMask) + product_low;
    bigits_[i] = tmp & kBigitMask;
    carry = (carry >> kBigitSize) + (tmp >> kBigitSize) +
        (product_high << (32 - kBigitSize));
  }
  while (carry != 0) {
    EnsureCapacity(used_digits_ + 1);
    bigits_[used_digits_] = carry & kBigitMask;
    used_digits_++;
    carry >>= kBigitSize;
  }
}